

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::Lower(Lowerer *this)

{
  LowererMD *this_00;
  Instr *pIVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  bool defaultDoLoopFastPath;
  bool bVar5;
  int32 iVar6;
  RegSlot RVar7;
  RegSlot RVar8;
  undefined4 *puVar9;
  StackSym *pSVar10;
  SymOpnd *pSVar11;
  IntConstOpnd *pIVar12;
  Instr *pIVar13;
  JITTimeFunctionBody *pJVar14;
  AddrOpnd *pAVar15;
  Instr *pIVar16;
  Instr *pIVar17;
  Func *pFVar18;
  uint i;
  int slotId;
  undefined1 local_110 [8];
  NoRecoverMemoryJitArenaAllocator localAlloc;
  BVSparse<Memory::JitArenaAllocator> localInitializedTempSym;
  BVSparse<Memory::JitArenaAllocator> localAddToLiveOnBackEdgeSyms;
  
  pFVar18 = this->m_func;
  pFVar18->topFunc->maintainByteCodeOffset = false;
  Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
            ((NoRecoverMemoryJitArenaAllocator *)local_110,L"BE-Lower",
             (pFVar18->m_alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.pageAllocator,Js::Throw::OutOfMemory);
  this->m_alloc = (JitArenaAllocator *)local_110;
  localInitializedTempSym.alloc = (Type)&localAlloc.super_JitArenaAllocator.bvFreeList;
  localAlloc.super_JitArenaAllocator.bvFreeList = (BVSparseNode *)0x0;
  localInitializedTempSym.head = (Type_conflict)0x0;
  this->initializedTempSym = (BVSparse<Memory::JitArenaAllocator> *)localInitializedTempSym.alloc;
  localInitializedTempSym.lastUsedNodePrevNextField = (Type)0x0;
  this->addToLiveOnBackEdgeSyms =
       (BVSparse<Memory::JitArenaAllocator> *)&localInitializedTempSym.lastUsedNodePrevNextField;
  localInitializedTempSym.lastFoundIndex = (Type_conflict)local_110;
  if (this->m_func->topFunc->m_cloneMap != (InstrMap *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2a,"(this->m_func->GetCloneMap() == nullptr)",
                       "this->m_func->GetCloneMap() == nullptr");
    if (!bVar4) goto LAB_0053dfef;
    *puVar9 = 0;
  }
  this_00 = &this->m_lowererMD;
  LowererMD::Init(this_00,this);
  bVar4 = Func::DoFastPaths(this->m_func);
  defaultDoLoopFastPath = Func::DoLoopFastPaths(this->m_func);
  pFVar18 = this->m_func;
  if (pFVar18->hasAnyStackNestedFunc == true) {
    EnsureStackFunctionListStackSym(this);
    pFVar18 = this->m_func;
  }
  if (pFVar18->stackClosure == true) {
    bVar5 = Func::IsLoopBody(pFVar18);
    if (!bVar5) {
      AllocStackClosure(this);
    }
  }
  AllocStackForInObjectEnumeratorArray(this);
  bVar5 = Func::IsJitInDebugMode(this->m_func);
  pFVar18 = this->m_func;
  if (bVar5) {
    iVar6 = Func::GetHasLocalVarChangedOffset(pFVar18);
    if (iVar6 != -1) {
      pSVar10 = StackSym::New(TyInt8,this->m_func);
      pSVar10->m_offset = iVar6;
      pSVar10->field_0x19 = pSVar10->field_0x19 | 0x10;
      pSVar11 = IR::SymOpnd::New(&pSVar10->super_Sym,TyInt8,this->m_func);
      pIVar12 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
      pIVar13 = Func::GetFunctionEntryInsertionPoint(this->m_func);
      InsertMove(&pSVar11->super_Opnd,&pIVar12->super_Opnd,pIVar13,true);
      pJVar14 = Func::GetJITFunctionBody(this->m_func);
      RVar7 = JITTimeFunctionBody::GetEndNonTempLocalIndex(pJVar14);
      pJVar14 = Func::GetJITFunctionBody(this->m_func);
      RVar8 = JITTimeFunctionBody::GetFirstNonTempLocalIndex(pJVar14);
      for (slotId = 0; RVar7 - RVar8 != slotId; slotId = slotId + 1) {
        iVar6 = Func::GetLocalVarSlotOffset(this->m_func,slotId);
        pIVar12 = IR::IntConstOpnd::New(-0x3131313131313132,TyInt64,this->m_func,false);
        pSVar10 = StackSym::New(TyInt64,this->m_func);
        pSVar10->m_offset = iVar6;
        pSVar10->field_0x19 = pSVar10->field_0x19 | 0x10;
        pSVar11 = IR::SymOpnd::New(&pSVar10->super_Sym,TyInt64,this->m_func);
        pIVar13 = Func::GetFunctionEntryInsertionPoint(this->m_func);
        InsertMove(&pSVar11->super_Opnd,&pIVar12->super_Opnd,pIVar13,true);
      }
    }
    pFVar18 = this->m_func;
    if (pFVar18->hasAnyStackNestedFunc == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x66,"(!m_func->HasAnyStackNestedFunc())",
                         "!m_func->HasAnyStackNestedFunc()");
      if (!bVar5) {
LAB_0053dfef:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
      pFVar18 = this->m_func;
    }
  }
  LowerRange(this,pFVar18->m_headInstr,pFVar18->m_tailInstr,bVar4,defaultDoLoopFastPath);
  if ((DAT_0145c43e == '\x01') && (DAT_0145c43f == '\x01')) {
    pIVar13 = this->m_func->m_headInstr;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while (pIVar17 = pIVar13, pIVar17 != (Instr *)0x0) {
      pIVar13 = pIVar17->m_next;
      if (pIVar17->m_src1 != (Opnd *)0x0) {
        bVar4 = IR::Opnd::IsAddrOpnd(pIVar17->m_src1);
        if (bVar4) {
          pAVar15 = IR::Opnd::AsAddrOpnd(pIVar17->m_src1);
          if (pAVar15->addrOpndKind == AddrOpndKindWriteBarrierCardTable) {
            pIVar1 = pIVar17->m_prev;
            pIVar2 = pIVar1->m_prev;
            pIVar16 = pIVar2;
            if (pIVar2->m_prev->m_opcode != LEA) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x7b,"(leaInstr->m_opcode == Js::OpCode::LEA)",
                                 "leaInstr->m_opcode == Js::OpCode::LEA");
              if (!bVar4) goto LAB_0053dfef;
              *puVar9 = 0;
              pIVar16 = pIVar1->m_prev;
            }
            if (pIVar16->m_opcode != MOV) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x7c,"(movInstr->m_opcode == Js::OpCode::MOV)",
                                 "movInstr->m_opcode == Js::OpCode::MOV");
              if (!bVar4) goto LAB_0053dfef;
              *puVar9 = 0;
            }
            if (pIVar17->m_prev->m_opcode != SHR) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x7d,"(shrInstr->m_opcode == Js::OpCode::SHR)",
                                 "shrInstr->m_opcode == Js::OpCode::SHR");
              if (!bVar4) goto LAB_0053dfef;
              *puVar9 = 0;
            }
            LowererMD::LoadHelperArgument(this_00,pIVar1->m_prev,pIVar2->m_prev->m_dst);
            pIVar17 = IR::Instr::New(Call,this->m_func);
            IR::Instr::InsertBefore(pIVar1->m_prev,pIVar17);
            LowererMD::ChangeToHelperCall
                      (this_00,pIVar17,HelperWriteBarrierSetVerifyBit,(LabelInstr *)0x0,(Opnd *)0x0,
                       (PropertySymOpnd *)0x0,false);
          }
        }
      }
    }
  }
  Func::ClearCloneMap(this->m_func);
  pFVar18 = this->m_func;
  if (pFVar18->hasAnyStackNestedFunc == true) {
    EnsureZeroLastStackFunctionNext(this);
    pFVar18 = this->m_func;
  }
  Func::IsSimpleJit(pFVar18);
  this->initializedTempSym = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->m_alloc = (JitArenaAllocator *)0x0;
  this->m_func->canHoistConstantAddressLoad = false;
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)
             &localInitializedTempSym.lastUsedNodePrevNextField);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse
            ((BVSparse<Memory::JitArenaAllocator> *)&localAlloc.super_JitArenaAllocator.bvFreeList);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_110);
  return;
}

Assistant:

void
Lowerer::Lower()
{

    this->m_func->StopMaintainByteCodeOffset();

    NoRecoverMemoryJitArenaAllocator localAlloc(_u("BE-Lower"), this->m_func->m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);
    this->m_alloc = &localAlloc;
    BVSparse<JitArenaAllocator> localInitializedTempSym(&localAlloc);
    this->initializedTempSym = &localInitializedTempSym;
    BVSparse<JitArenaAllocator> localAddToLiveOnBackEdgeSyms(&localAlloc);
    this->addToLiveOnBackEdgeSyms = &localAddToLiveOnBackEdgeSyms;
    Assert(this->m_func->GetCloneMap() == nullptr);

    m_lowererMD.Init(this);

    bool defaultDoFastPath = this->m_func->DoFastPaths();
    bool loopFastPath = this->m_func->DoLoopFastPaths();

    if (m_func->HasAnyStackNestedFunc())
    {
        EnsureStackFunctionListStackSym();
    }
    if (m_func->DoStackFrameDisplay() && !m_func->IsLoopBody())
    {
        AllocStackClosure();
    }

    AllocStackForInObjectEnumeratorArray();

    if (m_func->IsJitInDebugMode())
    {
        // Initialize metadata of local var slots.
        // Too late to wait until Register Allocator, as we need the offset when lowerering bailout for debugger.
        int32 hasLocalVarChangedOffset = m_func->GetHasLocalVarChangedOffset();
        if (hasLocalVarChangedOffset != Js::Constants::InvalidOffset)
        {
            // MOV [EBP + m_func->GetHasLocalVarChangedOffset()], 0
            StackSym* sym = StackSym::New(TyInt8, m_func);
            sym->m_offset = hasLocalVarChangedOffset;
            sym->m_allocated = true;
            IR::Opnd* opnd1 = IR::SymOpnd::New(sym, TyInt8, m_func);
            IR::Opnd* opnd2 = IR::IntConstOpnd::New(0, TyInt8, m_func);
            Lowerer::InsertMove(opnd1, opnd2, m_func->GetFunctionEntryInsertionPoint());

#ifdef DBG
            // Pre-fill all local slots with a pattern. This will help identify non-initialized/garbage var values.
            // Note that in the beginning of the function in bytecode we should initialize all locals to undefined.
            uint32 localSlotCount = m_func->GetJITFunctionBody()->GetEndNonTempLocalIndex() - m_func->GetJITFunctionBody()->GetFirstNonTempLocalIndex();
            for (uint i = 0; i < localSlotCount; ++i)
            {
                int offset = m_func->GetLocalVarSlotOffset(i);

                IRType opnd1Type;

#if defined(TARGET_32)
                opnd1Type = TyInt32;
                opnd2 = IR::IntConstOpnd::New(Func::c_debugFillPattern4, opnd1Type, m_func);
#else
                opnd1Type = TyInt64;
                opnd2 = IR::IntConstOpnd::New(Func::c_debugFillPattern8, opnd1Type, m_func);
#endif

                sym = StackSym::New(opnd1Type, m_func);
                sym->m_offset = offset;
                sym->m_allocated = true;
                opnd1 = IR::SymOpnd::New(sym, opnd1Type, m_func);
                Lowerer::InsertMove(opnd1, opnd2, m_func->GetFunctionEntryInsertionPoint());
            }
#endif
        }

        Assert(!m_func->HasAnyStackNestedFunc());
    }

    this->LowerRange(m_func->m_headInstr, m_func->m_tailInstr, defaultDoFastPath, loopFastPath);

#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
    // TODO: (leish)(swb) implement for arm
#if defined(_M_IX86) || defined(_M_AMD64)
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
    {
        // find out all write barrier setting instr, call Recycler::WBSetBit for verification purpose
        // should do this in LowererMD::GenerateWriteBarrier, however, can't insert call instruction there
        FOREACH_INSTR_EDITING(instr, instrNext, m_func->m_headInstr)
            if (instr->m_src1 && instr->m_src1->IsAddrOpnd())
            {
                IR::AddrOpnd* addrOpnd = instr->m_src1->AsAddrOpnd();
                if (addrOpnd->GetAddrOpndKind() == IR::AddrOpndKindWriteBarrierCardTable)
                {
                    auto& leaInstr = instr->m_prev->m_prev->m_prev;
                    auto& movInstr = instr->m_prev->m_prev;
                    auto& shrInstr = instr->m_prev;
                    Assert(leaInstr->m_opcode == Js::OpCode::LEA);
                    Assert(movInstr->m_opcode == Js::OpCode::MOV);
                    Assert(shrInstr->m_opcode == Js::OpCode::SHR);
                    m_lowererMD.LoadHelperArgument(movInstr, leaInstr->m_dst);
                    IR::Instr* instrCall = IR::Instr::New(Js::OpCode::Call, m_func);
                    movInstr->InsertBefore(instrCall);
                    m_lowererMD.ChangeToHelperCall(instrCall, IR::HelperWriteBarrierSetVerifyBit);
                }
            }
        NEXT_INSTR_EDITING
    }
#endif
#endif

    this->m_func->ClearCloneMap();

    if (m_func->HasAnyStackNestedFunc())
    {
        EnsureZeroLastStackFunctionNext();
    }

    if (!m_func->IsSimpleJit())
    {
#if 0 // TODO michhol oop jit, reenable assert
        Js::EntryPointInfo* entryPointInfo = this->m_func->m_workItem->GetEntryPoint();
        Assert(entryPointInfo->GetJitTransferData() != nullptr && !entryPointInfo->GetJitTransferData()->GetIsReady());
#endif
    }

    this->initializedTempSym = nullptr;
    this->m_alloc = nullptr;

    this->m_func->DisableConstandAddressLoadHoist();
}